

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::ProcessClientTrackedObjects(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict pSVar4;
  Type *ppvVar5;
  Type_conflict *ppSVar6;
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  long *plVar7;
  long extraout_RDX;
  code *local_a0;
  Type *reference;
  Iterator iter;
  Recycler *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  iter.current = (NodeBase *)this;
  if ((this->inPartialCollectMode & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1088,"(this->inPartialCollectMode)","this->inPartialCollectMode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = DoQueueTrackedObject(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x108a,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&this->clientTrackedObjectList);
  if (!bVar2) {
    SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)&reference,&this->clientTrackedObjectList);
    while( true ) {
      if (iter.list == (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      ppvVar5 = reference;
      pSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)ppvVar5,pSVar4);
      if (bVar2) break;
      iter.list = (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
                  SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppvVar5 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&reference);
      TryMarkNonInterior(this,*ppvVar5,ppvVar5);
      (this->collectionStats).clientTrackedObjectCount =
           (this->collectionStats).clientTrackedObjectCount + 1;
    }
    iter.list = (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    this_00 = &this->clientTrackedObjectList;
    ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&this_00->super_SListNodeBase<Memory::ArenaAllocator>);
    next = *ppSVar6;
    while (bVar2 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::IsHead(this_00,next),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
      pSVar4 = *ppSVar6;
      local_a0 = (code *)TypeAllocatorFunc<Memory::ArenaAllocator,_void_*>::GetFreeFunc();
      plVar7 = (long *)((long)&(this->clientTrackedObjectAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_Allocator.outOfMemoryFunc + extraout_RDX);
      if (((ulong)local_a0 & 1) != 0) {
        local_a0 = *(code **)(local_a0 + *plVar7 + -1);
      }
      (*local_a0)(plVar7,next,0x10);
      next = pSVar4;
    }
    SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Reset(this_00);
  }
  return;
}

Assistant:

void
Recycler::ProcessClientTrackedObjects()
{
    GCETW(GC_PROCESS_CLIENT_TRACKED_OBJECT_START, (this));

    Assert(this->inPartialCollectMode);
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif

    if (!this->clientTrackedObjectList.Empty())
    {
        SListBase<void *>::Iterator iter(&this->clientTrackedObjectList);
        while (iter.Next())
        {
            auto& reference = iter.Data();
            this->TryMarkNonInterior(reference, &reference /* parentReference */);  // Reference to inside the node
            RECYCLER_STATS_INC(this, clientTrackedObjectCount);
        }

        this->clientTrackedObjectList.Clear(&this->clientTrackedObjectAllocator);
    }

    GCETW(GC_PROCESS_CLIENT_TRACKED_OBJECT_STOP, (this));
}